

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.h
# Opt level: O3

shared_ptr<chrono::fea::ChNodeFEAbase> __thiscall
chrono::fea::ChElementShellBST::GetNodeN(ChElementShellBST *this,int n)

{
  undefined8 *puVar1;
  long lVar2;
  _func_int **pp_Var3;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined4 in_register_00000034;
  shared_ptr<chrono::fea::ChNodeFEAbase> sVar5;
  shared_ptr<chrono::fea::ChNodeFEAbase> sVar6;
  
  lVar2 = *(long *)(CONCAT44(in_register_00000034,n) + 0x78);
  _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)*(int *)(CONCAT44(in_register_00000034,n) + 0x5c + (long)in_EDX * 4) * 0x10);
  puVar1 = (undefined8 *)((long)&(_Var4._M_pi)->_vptr__Sp_counted_base + lVar2);
  pp_Var3 = (_func_int **)puVar1[1];
  lVar2 = *(long *)((long)&(_Var4._M_pi)->_M_use_count + lVar2);
  (this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)*puVar1;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock = pp_Var3;
  if (lVar2 != 0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      sVar5.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar5.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<chrono::fea::ChNodeFEAbase>)
             sVar5.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    UNLOCK();
  }
  sVar6.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var4._M_pi;
  sVar6.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::fea::ChNodeFEAbase>)
         sVar6.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<ChNodeFEAbase> GetNodeN(int n) override { return m_nodes[nodes_used_to_six[n]]; }